

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCircuit.hpp
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
qclab::QCircuit<float,_qclab::QObject<float>_>::qubits
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,
          QCircuit<float,_qclab::QObject<float>_> *this)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ulong uVar7;
  ulong uVar8;
  int iVar10;
  undefined1 auVar9 [16];
  int iVar11;
  int iVar14;
  undefined1 auVar13 [16];
  allocator_type local_11;
  undefined1 auVar12 [16];
  
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,(long)this->nbQubits_,&local_11);
  auVar6 = _DAT_00167030;
  auVar5 = _DAT_00167020;
  auVar4 = _DAT_00167010;
  piVar2 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  piVar3 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar2 != piVar3) {
    iVar1 = this->offset_;
    uVar7 = (long)piVar3 + (-4 - (long)piVar2);
    auVar13._8_4_ = (int)uVar7;
    auVar13._0_8_ = uVar7;
    auVar13._12_4_ = (int)(uVar7 >> 0x20);
    auVar9._0_8_ = uVar7 >> 2;
    auVar9._8_8_ = auVar13._8_8_ >> 2;
    uVar8 = 0;
    auVar9 = auVar9 ^ _DAT_00167030;
    do {
      iVar11 = (int)uVar8;
      auVar12._8_4_ = iVar11;
      auVar12._0_8_ = uVar8;
      auVar12._12_4_ = (int)(uVar8 >> 0x20);
      auVar13 = (auVar12 | auVar5) ^ auVar6;
      iVar10 = auVar9._4_4_;
      if ((bool)(~(auVar13._4_4_ == iVar10 && auVar9._0_4_ < auVar13._0_4_ || iVar10 < auVar13._4_4_
                  ) & 1)) {
        piVar2[uVar8] = iVar1 + iVar11;
      }
      if ((auVar13._12_4_ != auVar9._12_4_ || auVar13._8_4_ <= auVar9._8_4_) &&
          auVar13._12_4_ <= auVar9._12_4_) {
        piVar2[uVar8 + 1] = iVar1 + iVar11 + 1;
      }
      auVar13 = (auVar12 | auVar4) ^ auVar6;
      iVar14 = auVar13._4_4_;
      if (iVar14 <= iVar10 && (iVar14 != iVar10 || auVar13._0_4_ <= auVar9._0_4_)) {
        piVar2[uVar8 + 2] = iVar1 + iVar11 + 2;
        piVar2[uVar8 + 3] = iVar1 + iVar11 + 3;
      }
      uVar8 = uVar8 + 4;
    } while (((uVar7 >> 2) + 4 & 0xfffffffffffffffc) != uVar8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector< int > qubits() const override {
        std::vector< int > v( nbQubits_ ) ;
        std::iota( v.begin() , v.end() , offset_ ) ;
        return v ;
      }